

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::ObjectIntersector1<false>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  ulong uVar9;
  long lVar10;
  RTCIntersectFunctionN p_Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong unaff_R12;
  size_t mask;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  undefined8 uVar22;
  uint uVar23;
  uint uVar26;
  undefined1 auVar24 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  int mask_1;
  ulong local_1370;
  ulong local_1368;
  ulong local_1360;
  ulong local_1358;
  ulong local_1350;
  ulong local_1348;
  NodeRef *local_1340;
  RayQueryContext *local_1338;
  Scene *local_1330;
  ulong local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  undefined1 auVar25 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1340 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx((undefined1  [16])aVar2,auVar24);
      auVar28._8_4_ = 0x219392ef;
      auVar28._0_8_ = 0x219392ef219392ef;
      auVar28._12_4_ = 0x219392ef;
      auVar24 = vcmpps_avx(auVar24,auVar28,1);
      auVar24 = vblendvps_avx((undefined1  [16])aVar2,auVar28,auVar24);
      auVar28 = vrcpps_avx(auVar24);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = &DAT_3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar24 = vfnmadd231ps_fma(auVar29,auVar28,auVar24);
      auVar7 = vfmadd132ps_fma(auVar24,auVar28,auVar28);
      fVar27 = auVar7._0_4_;
      local_11f8._4_4_ = fVar27;
      local_11f8._0_4_ = fVar27;
      local_11f8._8_4_ = fVar27;
      local_11f8._12_4_ = fVar27;
      local_11f8._16_4_ = fVar27;
      local_11f8._20_4_ = fVar27;
      local_11f8._24_4_ = fVar27;
      local_11f8._28_4_ = fVar27;
      auVar35 = ZEXT3264(local_11f8);
      auVar24 = vmovshdup_avx(auVar7);
      uVar22 = auVar24._0_8_;
      local_1218._8_8_ = uVar22;
      local_1218._0_8_ = uVar22;
      local_1218._16_8_ = uVar22;
      local_1218._24_8_ = uVar22;
      auVar36 = ZEXT3264(local_1218);
      auVar29 = vshufpd_avx(auVar7,auVar7,1);
      auVar28 = vshufps_avx(auVar7,auVar7,0xaa);
      uVar22 = auVar28._0_8_;
      local_1238._8_8_ = uVar22;
      local_1238._0_8_ = uVar22;
      local_1238._16_8_ = uVar22;
      local_1238._24_8_ = uVar22;
      auVar37 = ZEXT3264(local_1238);
      auVar30._0_4_ = fVar27 * (ray->org).field_0.m128[0];
      auVar30._4_4_ = auVar7._4_4_ * (ray->org).field_0.m128[1];
      auVar30._8_4_ = auVar7._8_4_ * (ray->org).field_0.m128[2];
      auVar30._12_4_ = auVar7._12_4_ * (ray->org).field_0.m128[3];
      auVar28 = vmovshdup_avx(auVar30);
      auVar7 = vshufps_avx(auVar30,auVar30,0xaa);
      uVar14 = (ulong)(fVar27 < 0.0) << 5;
      uVar15 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
      uVar17 = uVar14 ^ 0x20;
      uVar18 = uVar15 ^ 0x20;
      uVar20 = uVar16 ^ 0x20;
      uVar13 = CONCAT44(auVar30._0_4_,auVar30._0_4_);
      local_1258._0_8_ = uVar13 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar30._0_4_;
      local_1258._12_4_ = -auVar30._0_4_;
      local_1258._16_4_ = -auVar30._0_4_;
      local_1258._20_4_ = -auVar30._0_4_;
      local_1258._24_4_ = -auVar30._0_4_;
      local_1258._28_4_ = -auVar30._0_4_;
      auVar33 = ZEXT3264(local_1258);
      uVar23 = auVar28._0_4_;
      uVar26 = auVar28._4_4_;
      local_1278._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar23 ^ 0x80000000;
      local_1278._12_4_ = uVar26 ^ 0x80000000;
      local_1278._16_4_ = uVar23 ^ 0x80000000;
      local_1278._20_4_ = uVar26 ^ 0x80000000;
      local_1278._24_4_ = uVar23 ^ 0x80000000;
      local_1278._28_4_ = uVar26 ^ 0x80000000;
      auVar25 = ZEXT3264(local_1278);
      uVar23 = auVar7._0_4_;
      uVar26 = auVar7._4_4_;
      local_1298._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar23 ^ 0x80000000;
      local_1298._12_4_ = uVar26 ^ 0x80000000;
      local_1298._16_4_ = uVar23 ^ 0x80000000;
      local_1298._20_4_ = uVar26 ^ 0x80000000;
      local_1298._24_4_ = uVar23 ^ 0x80000000;
      local_1298._28_4_ = uVar26 ^ 0x80000000;
      auVar31 = ZEXT3264(local_1298);
      uVar8 = auVar3._0_4_;
      local_12b8._4_4_ = uVar8;
      local_12b8._0_4_ = uVar8;
      local_12b8._8_4_ = uVar8;
      local_12b8._12_4_ = uVar8;
      local_12b8._16_4_ = uVar8;
      local_12b8._20_4_ = uVar8;
      local_12b8._24_4_ = uVar8;
      local_12b8._28_4_ = uVar8;
      auVar32 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar34 = ZEXT3264(local_12d8);
      local_1370 = uVar20;
      local_1368 = uVar18;
      local_1360 = uVar17;
      local_1358 = uVar16;
      local_1350 = uVar15;
      local_1348 = uVar14;
      local_1338 = context;
      do {
        if (local_1340 == stack) {
          return;
        }
        uVar13 = local_1340[-1].ptr;
        local_1340 = local_1340 + -1;
        do {
          if ((uVar13 & 8) == 0) {
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar14),auVar33._0_32_,
                                      auVar35._0_32_);
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar15),auVar25._0_32_,
                                     auVar36._0_32_);
            auVar4 = vpmaxsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar3));
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar16),auVar31._0_32_,
                                      auVar37._0_32_);
            auVar5 = vpmaxsd_avx2(ZEXT1632(auVar24),auVar32._0_32_);
            auVar4 = vpmaxsd_avx2(auVar4,auVar5);
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar17),auVar33._0_32_,
                                      auVar35._0_32_);
            auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar18),auVar25._0_32_,
                                     auVar36._0_32_);
            auVar5 = vpminsd_avx2(ZEXT1632(auVar24),ZEXT1632(auVar3));
            auVar24 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar13 + 0x40 + uVar20),auVar31._0_32_,
                                      auVar37._0_32_);
            auVar6 = vpminsd_avx2(ZEXT1632(auVar24),auVar34._0_32_);
            auVar5 = vpminsd_avx2(auVar5,auVar6);
            auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
            uVar8 = vmovmskps_avx(auVar4);
            unaff_R12 = (ulong)(byte)~(byte)uVar8;
          }
          if ((uVar13 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar19 = 4;
            }
            else {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              lVar10 = 0;
              for (uVar13 = unaff_R12; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
              {
                lVar10 = lVar10 + 1;
              }
              iVar19 = 0;
              for (uVar9 = unaff_R12 - 1 & unaff_R12; uVar13 = *(ulong *)(uVar12 + lVar10 * 8),
                  uVar9 != 0; uVar9 = uVar9 - 1 & uVar9) {
                local_1340->ptr = uVar13;
                local_1340 = local_1340 + 1;
                lVar10 = 0;
                for (uVar13 = uVar9; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                  lVar10 = lVar10 + 1;
                }
              }
            }
          }
          else {
            iVar19 = 6;
          }
        } while (iVar19 == 0);
        if (iVar19 == 6) {
          iVar19 = 0;
          local_1328 = (ulong)((uint)uVar13 & 0xf) - 8;
          bVar21 = local_1328 != 0;
          if (bVar21) {
            local_1330 = local_1338->scene;
            uVar12 = 0;
            do {
              local_1320.geomID = *(uint *)((uVar13 & 0xfffffffffffffff0) + uVar12 * 8);
              local_12f0 = (local_1330->geometries).items[local_1320.geomID].ptr;
              if ((ray->mask & local_12f0->mask) != 0) {
                local_1320.primID = *(uint *)((uVar13 & 0xfffffffffffffff0) + 4 + uVar12 * 8);
                mask_1 = -1;
                local_1320.valid = &mask_1;
                local_1320.geometryUserPtr = local_12f0->userPtr;
                local_1320.context = local_1338->user;
                local_1320.N = 1;
                local_12e8 = 0;
                local_12e0 = local_1338->args;
                p_Var11 = local_12e0->intersect;
                if (p_Var11 == (RTCIntersectFunctionN)0x0) {
                  p_Var11 = (RTCIntersectFunctionN)
                            local_12f0[1].super_RefCount.refCounter.
                            super___atomic_base<unsigned_long>._M_i;
                }
                local_1320.rayhit = (RTCRayHitN *)ray;
                (*p_Var11)(&local_1320);
                auVar35 = ZEXT3264(local_11f8);
                auVar36 = ZEXT3264(local_1218);
                auVar37 = ZEXT3264(local_1238);
                auVar33 = ZEXT3264(local_1258);
                auVar25 = ZEXT3264(local_1278);
                auVar31 = ZEXT3264(local_1298);
                auVar32 = ZEXT3264(local_12b8);
                auVar34 = ZEXT3264(local_12d8);
                if (ray->tfar < 0.0) {
                  uVar14 = local_1348;
                  uVar15 = local_1350;
                  uVar16 = local_1358;
                  uVar17 = local_1360;
                  uVar18 = local_1368;
                  uVar20 = local_1370;
                  if (bVar21) {
                    ray->tfar = -INFINITY;
                    iVar19 = 3;
                  }
                  break;
                }
              }
              uVar12 = uVar12 + 1;
              bVar21 = uVar12 < local_1328;
              uVar14 = local_1348;
              uVar15 = local_1350;
              uVar16 = local_1358;
              uVar17 = local_1360;
              uVar18 = local_1368;
              uVar20 = local_1370;
            } while (uVar12 != local_1328);
          }
        }
      } while (iVar19 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }